

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragScalarN(char *label,ImGuiDataType data_type,void *p_data,int components,
                       float v_speed,void *p_min,void *p_max,char *format,float power)

{
  bool bVar1;
  ImGuiWindow *pIVar2;
  char *pcVar3;
  int in_ECX;
  int in_ESI;
  char *in_RDI;
  char *label_end;
  int i;
  size_t type_size;
  bool value_changed;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImGuiTextFlags in_stack_000000b4;
  char *in_stack_000000b8;
  char *in_stack_000000c0;
  float in_stack_000000e4;
  char *in_stack_000000e8;
  void *in_stack_000000f0;
  void *in_stack_000000f8;
  float in_stack_00000104;
  void *in_stack_00000108;
  ImGuiDataType in_stack_00000114;
  char *in_stack_00000118;
  undefined8 in_stack_ffffffffffffff90;
  int local_64;
  char *in_stack_ffffffffffffffa0;
  size_t sVar4;
  ImGuiContext *pIVar5;
  bool local_1;
  
  pIVar2 = GetCurrentWindow();
  if ((pIVar2->SkipItems & 1U) == 0) {
    local_1 = false;
    pIVar5 = GImGui;
    BeginGroup();
    PushID(in_stack_ffffffffffffffa0);
    CalcItemWidth();
    PushMultiItemsWidths((int)((ulong)pIVar5 >> 0x20),SUB84(pIVar5,0));
    sVar4 = GDataTypeInfo[in_ESI].Size;
    for (local_64 = 0; local_64 < in_ECX; local_64 = local_64 + 1) {
      PushID((int)(sVar4 >> 0x20));
      if (0 < local_64) {
        SameLine((float)((ulong)in_stack_ffffffffffffff90 >> 0x20),(float)in_stack_ffffffffffffff90)
        ;
      }
      bVar1 = DragScalar(in_stack_00000118,in_stack_00000114,in_stack_00000108,in_stack_00000104,
                         in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,in_stack_000000e4);
      local_1 = local_1 != false || bVar1;
      PopID();
      PopItemWidth();
    }
    PopID();
    pcVar3 = FindRenderedTextEnd(in_RDI,(char *)0x0);
    if (in_RDI != pcVar3) {
      SameLine((float)((ulong)pcVar3 >> 0x20),SUB84(pcVar3,0));
      TextEx(in_stack_000000c0,in_stack_000000b8,in_stack_000000b4);
    }
    EndGroup();
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::DragScalarN(const char* label, ImGuiDataType data_type, void* p_data, int components, float v_speed, const void* p_min, const void* p_max, const char* format, float power)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    bool value_changed = false;
    BeginGroup();
    PushID(label);
    PushMultiItemsWidths(components, CalcItemWidth());
    size_t type_size = GDataTypeInfo[data_type].Size;
    for (int i = 0; i < components; i++)
    {
        PushID(i);
        if (i > 0)
            SameLine(0, g.Style.ItemInnerSpacing.x);
        value_changed |= DragScalar("", data_type, p_data, v_speed, p_min, p_max, format, power);
        PopID();
        PopItemWidth();
        p_data = (void*)((char*)p_data + type_size);
    }
    PopID();

    const char* label_end = FindRenderedTextEnd(label);
    if (label != label_end)
    {
        SameLine(0, g.Style.ItemInnerSpacing.x);
        TextEx(label, label_end);
    }

    EndGroup();
    return value_changed;
}